

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O2

Class objc_upgrade_class(objc_class_gsv1 *oldClass)

{
  uint64_t uVar1;
  char cVar2;
  int iVar3;
  objc_ivar_list_gcc *poVar4;
  objc_ivar_list_gcc type;
  bool bVar5;
  int *piVar6;
  BOOL BVar7;
  Class aClass;
  objc_ivar_list *poVar8;
  objc_ivar_list_gcc *poVar9;
  size_t align;
  objc_method_list *poVar10;
  objc_property_list *poVar11;
  Class poVar12;
  uint uVar13;
  int iVar14;
  uint64_t field;
  int iVar15;
  int iVar16;
  int iVar17;
  objc_ivar_list_gcc *poVar18;
  ulong uVar19;
  Ivar ivar;
  
  aClass = (Class)calloc(0x88,1);
  aClass->isa = oldClass->isa;
  aClass->name = oldClass->name;
  aClass->version = oldClass->version;
  aClass->info = 1;
  aClass->instance_size = oldClass->instance_size;
  poVar4 = oldClass->ivars;
  if (poVar4 == (objc_ivar_list_gcc *)0x0) {
    poVar8 = (objc_ivar_list *)0x0;
  }
  else {
    iVar16 = poVar4->count;
    uVar19 = (ulong)iVar16;
    poVar8 = (objc_ivar_list *)calloc(1,uVar19 << 5 | 0x10);
    poVar8->size = 0x20;
    poVar8->count = iVar16;
    poVar18 = poVar4 + 9;
    iVar16 = 1;
    field = 0;
    while (iVar14 = (int)uVar19, (long)field < (long)iVar14) {
      uVar1 = field + 1;
      iVar3 = poVar4[field * 3 + 3].count;
      if ((int)uVar1 < iVar14) {
        iVar17 = poVar4[uVar1 * 3 + 3].count;
        poVar9 = poVar18;
        iVar15 = iVar16;
        if (iVar3 != iVar17) goto LAB_00116eed;
        do {
          if (iVar14 <= iVar15 + 1) goto LAB_00116edd;
          piVar6 = &poVar9->count;
          poVar9 = poVar9 + 3;
          iVar15 = iVar15 + 1;
        } while (*piVar6 == iVar3);
        iVar14 = *piVar6 - iVar3;
        if (iVar14 == 0) {
LAB_00116edd:
          iVar14 = (int)oldClass->instance_size - iVar3;
        }
        bVar5 = false;
        iVar17 = iVar3;
      }
      else {
        iVar17 = (int)oldClass->instance_size;
LAB_00116eed:
        iVar14 = 0;
        bVar5 = true;
      }
      iVar15 = -iVar17;
      if (0 < iVar17) {
        iVar15 = iVar17;
      }
      type = poVar4[field * 3 + 2];
      *(objc_ivar_list_gcc *)(poVar8 + field * 2 + 1) = poVar4[field * 3 + 1];
      if (bVar5) {
        iVar14 = iVar15 - iVar3;
      }
      poVar8[field * 2 + 1].size = (size_t)type;
      *(int *)&poVar8[field * 2 + 2].size = iVar14;
      if ((oldClass->info & 0x10) == 0) {
        poVar9 = poVar4 + field * 3 + 3;
      }
      else {
        poVar9 = (objc_ivar_list_gcc *)oldClass->ivar_offsets[field];
      }
      ivar = (Ivar)(poVar8 + field * 2 + 1);
      ivar->offset = &poVar9->count;
      align = 8;
      if (type == (objc_ivar_list_gcc)0x0) {
LAB_00116f5c:
        cVar2 = *(char *)type;
        ivarSetAlign(ivar,align);
        if (cVar2 == '\0') goto LAB_00116f81;
      }
      else {
        if (*(char *)type != '\0') {
          align = objc_alignof_type((char *)type);
          goto LAB_00116f5c;
        }
        ivar->flags = ivar->flags & 0xfffffe07 | 0x18;
LAB_00116f81:
        ivarSetAlign(ivar,(long)(iVar15 - iVar3));
      }
      uVar13 = 3;
      if (((oldClass->info & 0x10) != 0) && (1 < (int)oldClass->abi_version + 1)) {
        BVar7 = objc_bitfield_test(oldClass->strong_pointers,field);
        uVar13 = 1;
        if (BVar7 == '\0') {
          BVar7 = objc_bitfield_test(oldClass->weak_pointers,field);
          uVar13 = (BVar7 == '\0') + 2;
        }
      }
      ivar->flags = ivar->flags & 0xfffffffc | uVar13;
      poVar18 = poVar18 + 3;
      iVar16 = iVar16 + 1;
      field = uVar1;
      uVar19 = (ulong)(uint)poVar4->count;
    }
  }
  aClass->ivars = poVar8;
  poVar10 = upgradeMethodList(oldClass->methods);
  aClass->methods = poVar10;
  aClass->protocols = oldClass->protocols;
  aClass->abi_version = oldClass->abi_version;
  poVar11 = upgradePropertyList(oldClass->properties);
  aClass->properties = poVar11;
  objc_register_selectors_from_class(aClass);
  if ((oldClass->info & 2) == 0) {
    aClass->info = 0;
    poVar12 = objc_upgrade_class((objc_class_gsv1 *)aClass->isa);
    aClass->isa = poVar12;
    objc_setAssociatedObject((id_conflict)aClass,&legacy_key,(id_conflict)oldClass,0);
  }
  else {
    aClass->instance_size = 0x88;
  }
  return aClass;
}

Assistant:

PRIVATE Class objc_upgrade_class(struct objc_class_gsv1 *oldClass)
{
	Class cls = calloc(sizeof(struct objc_class), 1);
	cls->isa = oldClass->isa;
	// super_class is left nil and we upgrade it later.
	cls->name = oldClass->name;
	cls->version = oldClass->version;
	cls->info = objc_class_flag_meta;
	cls->instance_size = oldClass->instance_size;
	cls->ivars = upgradeIvarList(oldClass);
	cls->methods = upgradeMethodList(oldClass->methods);
	cls->protocols = oldClass->protocols;
	cls->abi_version = oldClass->abi_version;
	cls->properties = upgradePropertyList(oldClass->properties);
	objc_register_selectors_from_class(cls);
	if (!objc_test_class_flag_gsv1(oldClass, objc_class_flag_meta_gsv1))
	{
		cls->info = 0;
		cls->isa = objc_upgrade_class((struct objc_class_gsv1*)cls->isa);
		objc_setAssociatedObject((id)cls, &legacy_key, (id)oldClass, OBJC_ASSOCIATION_ASSIGN);
	}
	else
	{
		cls->instance_size = sizeof(struct objc_class);
	}
	return cls;
}